

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GLPositionCase::init
          (GLPositionCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  uint uVar2;
  ContextInfo *pCVar3;
  pointer pbVar4;
  CaseType CVar5;
  Context *this_00;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar6;
  RenderTarget *renderTarget;
  long *plVar7;
  SharedPtrStateBase *pSVar8;
  long *extraout_RAX;
  TestError *this_01;
  undefined1 usePointMode;
  size_type *psVar9;
  ContextInfo *pCVar10;
  pointer pbVar11;
  Context *pCVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  _Base_ptr *pp_Var14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  TessPrimitiveType extraout_EDX;
  TessPrimitiveType extraout_EDX_00;
  TessPrimitiveType extraout_EDX_01;
  TessPrimitiveType extraout_EDX_02;
  TessPrimitiveType extraout_EDX_03;
  TessPrimitiveType extraout_EDX_04;
  TessPrimitiveType extraout_EDX_05;
  TessPrimitiveType primType;
  long extraout_RDX;
  char *pcVar17;
  long lVar18;
  char *pcVar19;
  bool bVar20;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tesIn2;
  string tesIn1;
  string tesIn0;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  size_type *local_488;
  value_type local_480;
  size_type *local_460;
  value_type local_458;
  string local_438;
  Context *local_418;
  long local_410;
  Context local_408;
  undefined1 local_3f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3e0;
  size_type *local_3d0;
  value_type local_3c8;
  Context *local_3a8;
  long local_3a0;
  Context local_398;
  string local_380;
  string local_360;
  string local_340;
  long *local_320 [2];
  long local_310 [2];
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  Context *local_2c0;
  long local_2b8;
  Context local_2b0;
  long local_298;
  undefined1 local_290 [40];
  long lStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  long local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  _Base_ptr local_230;
  long lStack_228;
  _Rb_tree_node_base *local_220;
  long local_218;
  _Rb_tree_node_base local_210;
  _Rb_tree_node_base local_1f0;
  _Rb_tree_node_base local_1d0;
  _Rb_tree_node_base local_1b0;
  _Rb_tree_node_base local_190;
  _Rb_tree_node_base local_170;
  _Rb_tree_node_base local_150;
  undefined1 local_130 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [24];
  pointer pbStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  CVar5 = this->m_caseType;
  uVar2 = CVar5 - CASETYPE_TCS_TO_TES;
  bVar20 = uVar2 < 2;
  pcVar17 = "in_te_attr[0]";
  if (bVar20) {
    pcVar17 = "gl_in[0].gl_Position";
  }
  local_2e0[0] = local_2d0;
  lVar18 = 0xd;
  if (bVar20) {
    lVar18 = 0x14;
  }
  pcVar19 = "in_te_attr[1]";
  if (bVar20) {
    pcVar19 = "gl_in[1].gl_Position";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,pcVar17,pcVar17 + lVar18);
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,pcVar19,pcVar19 + lVar18);
  pcVar17 = "in_te_attr[2]";
  if (uVar2 < 2) {
    pcVar17 = "gl_in[2].gl_Position";
  }
  local_320[0] = local_310;
  pcVar19 = pcVar17 + 0xd;
  if (uVar2 < 2) {
    pcVar19 = pcVar17 + 0x14;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,pcVar17,pcVar19);
  pcVar17 = "out highp vec4 in_tc_attr;\n";
  if ((CVar5 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar17 = "";
  }
  local_460 = &local_458._M_string_length;
  pcVar19 = pcVar17 + 0x1b;
  if ((CVar5 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar19 = pcVar17;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,pcVar17,pcVar19);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,0x97044b);
  local_488 = &local_480._M_string_length;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_480._M_string_length = *psVar9;
    local_480.field_2._M_allocated_capacity = plVar7[3];
  }
  else {
    local_480._M_string_length = *psVar9;
    local_488 = (size_type *)*plVar7;
  }
  local_480._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_488);
  pCVar3 = (ContextInfo *)(local_3f0 + 8);
  pCVar10 = (ContextInfo *)(plVar7 + 2);
  if ((ContextInfo *)*plVar7 == pCVar10) {
    local_3f0._8_8_ = pCVar10->_vptr_ContextInfo;
    aStack_3e0._M_allocated_capacity = plVar7[3];
    local_408.m_contextInfo = pCVar3;
  }
  else {
    local_3f0._8_8_ = pCVar10->_vptr_ContextInfo;
    local_408.m_contextInfo = (ContextInfo *)*plVar7;
  }
  local_3f0._0_8_ = plVar7[1];
  *plVar7 = (long)pCVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_408.m_contextInfo);
  pbVar4 = (pointer)(local_100 + 0x10);
  pbVar11 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar11) {
    local_100._16_8_ = (pbVar11->_M_dataplus)._M_p;
    pbStack_e8 = (pointer)plVar7[3];
    local_100._0_8_ = pbVar4;
  }
  else {
    local_100._16_8_ = (pbVar11->_M_dataplus)._M_p;
    local_100._0_8_ = (pointer)*plVar7;
  }
  local_100._8_8_ = plVar7[1];
  *plVar7 = (long)pbVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_100);
  local_2b0.m_contextInfo = (ContextInfo *)local_290;
  pCVar10 = (ContextInfo *)(plVar7 + 2);
  if ((ContextInfo *)*plVar7 == pCVar10) {
    local_290._0_8_ = pCVar10->_vptr_ContextInfo;
    local_290._8_8_ = plVar7[3];
  }
  else {
    local_290._0_8_ = pCVar10->_vptr_ContextInfo;
    local_2b0.m_contextInfo = (ContextInfo *)*plVar7;
  }
  local_298 = plVar7[1];
  *plVar7 = (long)pCVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((pointer)local_100._0_8_ != pbVar4) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if (local_408.m_contextInfo != pCVar3) {
    operator_delete(local_408.m_contextInfo,local_3f0._8_8_ + 1);
  }
  if (local_488 != &local_480._M_string_length) {
    operator_delete(local_488,local_480._M_string_length + 1);
  }
  if (local_460 != &local_458._M_string_length) {
    operator_delete(local_460,local_458._M_string_length + 1);
  }
  pcVar17 = "in highp vec4 in_tc_attr[];\n";
  if ((CVar5 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar17 = "";
  }
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  pcVar19 = pcVar17 + 0x1c;
  if ((CVar5 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar19 = pcVar17;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,pcVar17,pcVar19);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,0x9704a2);
  local_418 = &local_408;
  pCVar12 = (Context *)(plVar7 + 2);
  if ((Context *)*plVar7 == pCVar12) {
    local_408.m_testCtx = pCVar12->m_testCtx;
    local_408.m_renderCtx = (RenderContext *)plVar7[3];
  }
  else {
    local_408.m_testCtx = pCVar12->m_testCtx;
    local_418 = (Context *)*plVar7;
  }
  local_410 = plVar7[1];
  *plVar7 = (long)pCVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_418);
  local_3a8 = &local_398;
  pCVar12 = (Context *)(plVar7 + 2);
  if ((Context *)*plVar7 == pCVar12) {
    local_398.m_testCtx = pCVar12->m_testCtx;
    local_398.m_renderCtx = (RenderContext *)plVar7[3];
  }
  else {
    local_398.m_testCtx = pCVar12->m_testCtx;
    local_3a8 = (Context *)*plVar7;
  }
  local_3a0 = plVar7[1];
  *plVar7 = (long)pCVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  local_3d0 = &local_3c8._M_string_length;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_3c8._M_string_length = *psVar9;
    local_3c8.field_2._M_allocated_capacity = plVar7[3];
  }
  else {
    local_3c8._M_string_length = *psVar9;
    local_3d0 = (size_type *)*plVar7;
  }
  local_3c8._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  local_460 = &local_458._M_string_length;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_458._M_string_length = *psVar9;
    local_458.field_2._M_allocated_capacity = plVar7[3];
  }
  else {
    local_458._M_string_length = *psVar9;
    local_460 = (size_type *)*plVar7;
  }
  local_458._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_488 = &local_480._M_string_length;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_480._M_string_length = *psVar9;
    local_480.field_2._M_allocated_capacity = plVar7[3];
  }
  else {
    local_480._M_string_length = *psVar9;
    local_488 = (size_type *)*plVar7;
  }
  local_480._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_488);
  pCVar10 = (ContextInfo *)(plVar7 + 2);
  if ((ContextInfo *)*plVar7 == pCVar10) {
    local_3f0._8_8_ = pCVar10->_vptr_ContextInfo;
    aStack_3e0._M_allocated_capacity = plVar7[3];
    local_408.m_contextInfo = pCVar3;
  }
  else {
    local_3f0._8_8_ = pCVar10->_vptr_ContextInfo;
    local_408.m_contextInfo = (ContextInfo *)*plVar7;
  }
  local_3f0._0_8_ = plVar7[1];
  *plVar7 = (long)pCVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_408.m_contextInfo);
  pbVar11 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar11) {
    local_100._16_8_ = (pbVar11->_M_dataplus)._M_p;
    pbStack_e8 = (pointer)plVar7[3];
    local_100._0_8_ = pbVar4;
  }
  else {
    local_100._16_8_ = (pbVar11->_M_dataplus)._M_p;
    local_100._0_8_ = (pointer)*plVar7;
  }
  local_100._8_8_ = plVar7[1];
  *plVar7 = (long)pbVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_100);
  local_2c0 = &local_2b0;
  pCVar12 = (Context *)(plVar7 + 2);
  if ((Context *)*plVar7 == pCVar12) {
    local_2b0.m_testCtx = pCVar12->m_testCtx;
    local_2b0.m_renderCtx = (RenderContext *)plVar7[3];
  }
  else {
    local_2b0.m_testCtx = pCVar12->m_testCtx;
    local_2c0 = (Context *)*plVar7;
  }
  lVar18 = plVar7[1];
  *plVar7 = (long)pCVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_2b8 = lVar18;
  if ((pointer)local_100._0_8_ != pbVar4) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
    lVar18 = extraout_RDX;
  }
  usePointMode = SUB81(pCVar12,0);
  primType = (TessPrimitiveType)lVar18;
  if (local_408.m_contextInfo != pCVar3) {
    operator_delete(local_408.m_contextInfo,local_3f0._8_8_ + 1);
    primType = extraout_EDX;
  }
  if (local_488 != &local_480._M_string_length) {
    operator_delete(local_488,local_480._M_string_length + 1);
    primType = extraout_EDX_00;
  }
  if (local_460 != &local_458._M_string_length) {
    operator_delete(local_460,local_458._M_string_length + 1);
    primType = extraout_EDX_01;
  }
  if (local_3d0 != &local_3c8._M_string_length) {
    operator_delete(local_3d0,local_3c8._M_string_length + 1);
    primType = extraout_EDX_02;
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,(ulong)((long)&(local_398.m_testCtx)->m_platform + 1));
    primType = extraout_EDX_03;
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,(ulong)((long)&(local_408.m_testCtx)->m_platform + 1));
    primType = extraout_EDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    primType = extraout_EDX_05;
  }
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)(local_130 + 0x10),(_anonymous_namespace_ *)0x0,primType,(bool)usePointMode);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)(local_130 + 0x10),0,(char *)0x0,0x96eea1);
  local_290._16_8_ = local_290 + 0x20;
  pCVar10 = (ContextInfo *)(plVar7 + 2);
  if ((ContextInfo *)*plVar7 == pCVar10) {
    local_290._32_8_ = pCVar10->_vptr_ContextInfo;
    lStack_268 = plVar7[3];
  }
  else {
    local_290._32_8_ = pCVar10->_vptr_ContextInfo;
    local_290._16_8_ = (ContextInfo *)*plVar7;
  }
  local_290._24_8_ = plVar7[1];
  *plVar7 = (long)pCVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_290 + 0x10);
  local_260 = &local_250;
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar7 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7 == pbVar13) {
    local_250._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    local_250._M_string_length = plVar7[3];
  }
  else {
    local_250._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
  }
  local_258 = plVar7[1];
  *plVar7 = (long)pbVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_250.field_2._M_allocated_capacity = (size_type)&local_230;
  pp_Var14 = (_Base_ptr *)(plVar7 + 2);
  if ((_Base_ptr *)*plVar7 == pp_Var14) {
    local_230 = *pp_Var14;
    lStack_228 = plVar7[3];
  }
  else {
    local_230 = *pp_Var14;
    local_250.field_2._M_allocated_capacity = (size_type)(_Base_ptr *)*plVar7;
  }
  local_250.field_2._8_8_ = plVar7[1];
  *plVar7 = (long)pp_Var14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_250.field_2._M_local_buf);
  local_220 = &local_210;
  p_Var15 = (_Rb_tree_node_base *)(plVar7 + 2);
  if ((_Rb_tree_node_base *)*plVar7 == p_Var15) {
    local_210._0_8_ = *(undefined8 *)p_Var15;
    local_210._M_parent = (_Base_ptr)plVar7[3];
  }
  else {
    local_210._0_8_ = *(undefined8 *)p_Var15;
    local_220 = (_Rb_tree_node_base *)*plVar7;
  }
  local_218 = plVar7[1];
  *plVar7 = (long)p_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_2e0[0]);
  local_210._M_left = &local_1f0;
  p_Var15 = (_Rb_tree_node_base *)(plVar7 + 2);
  if ((_Rb_tree_node_base *)*plVar7 == p_Var15) {
    local_1f0._0_8_ = *(undefined8 *)p_Var15;
    local_1f0._M_parent = (_Base_ptr)plVar7[3];
  }
  else {
    local_1f0._0_8_ = *(undefined8 *)p_Var15;
    local_210._M_left = (_Rb_tree_node_base *)*plVar7;
  }
  local_210._M_right = (_Base_ptr)plVar7[1];
  *plVar7 = (long)p_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_210._M_left);
  local_1f0._M_left = &local_1d0;
  p_Var15 = (_Rb_tree_node_base *)(plVar7 + 2);
  if ((_Rb_tree_node_base *)*plVar7 == p_Var15) {
    local_1d0._0_8_ = *(undefined8 *)p_Var15;
    local_1d0._M_parent = (_Base_ptr)plVar7[3];
  }
  else {
    local_1d0._0_8_ = *(undefined8 *)p_Var15;
    local_1f0._M_left = (_Rb_tree_node_base *)*plVar7;
  }
  local_1f0._M_right = (_Base_ptr)plVar7[1];
  *plVar7 = (long)p_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_1f0._M_left,(ulong)local_300[0]);
  local_1d0._M_left = &local_1b0;
  p_Var15 = (_Rb_tree_node_base *)(plVar7 + 2);
  if ((_Rb_tree_node_base *)*plVar7 == p_Var15) {
    local_1b0._0_8_ = *(undefined8 *)p_Var15;
    local_1b0._M_parent = (_Base_ptr)plVar7[3];
  }
  else {
    local_1b0._0_8_ = *(undefined8 *)p_Var15;
    local_1d0._M_left = (_Rb_tree_node_base *)*plVar7;
  }
  local_1d0._M_right = (_Base_ptr)plVar7[1];
  *plVar7 = (long)p_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0._M_left);
  local_1b0._M_left = &local_190;
  p_Var15 = (_Rb_tree_node_base *)(plVar7 + 2);
  if ((_Rb_tree_node_base *)*plVar7 == p_Var15) {
    local_190._0_8_ = *(undefined8 *)p_Var15;
    local_190._M_parent = (_Base_ptr)plVar7[3];
  }
  else {
    local_190._0_8_ = *(undefined8 *)p_Var15;
    local_1b0._M_left = (_Rb_tree_node_base *)*plVar7;
  }
  local_1b0._M_right = (_Base_ptr)plVar7[1];
  *plVar7 = (long)p_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_1b0._M_left,(ulong)local_320[0]);
  local_190._M_left = &local_170;
  p_Var15 = (_Rb_tree_node_base *)(plVar7 + 2);
  if ((_Rb_tree_node_base *)*plVar7 == p_Var15) {
    local_170._0_8_ = *(undefined8 *)p_Var15;
    local_170._M_parent = (_Base_ptr)plVar7[3];
  }
  else {
    local_170._0_8_ = *(undefined8 *)p_Var15;
    local_190._M_left = (_Rb_tree_node_base *)*plVar7;
  }
  local_190._M_right = (_Base_ptr)plVar7[1];
  *plVar7 = (long)p_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_190._M_left);
  p_Var15 = (_Rb_tree_node_base *)(plVar7 + 2);
  if ((_Rb_tree_node_base *)*plVar7 == p_Var15) {
    local_150._0_8_ = *(undefined8 *)p_Var15;
    local_150._M_parent = (_Base_ptr)plVar7[3];
    local_170._M_left = &local_150;
  }
  else {
    local_150._0_8_ = *(undefined8 *)p_Var15;
    local_170._M_left = (_Rb_tree_node_base *)*plVar7;
  }
  local_170._M_right = (_Base_ptr)plVar7[1];
  *plVar7 = (long)p_Var15;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_170._M_left,(ulong)local_2e0[0]);
  p_Var16 = (_Base_ptr)(plVar7 + 2);
  if ((_Base_ptr)*plVar7 == p_Var16) {
    local_130._0_8_ = *(undefined8 *)p_Var16;
    local_130._8_8_ = plVar7[3];
    local_150._M_left = (_Base_ptr)local_130;
  }
  else {
    local_130._0_8_ = *(undefined8 *)p_Var16;
    local_150._M_left = (_Base_ptr)*plVar7;
  }
  local_150._M_right = (_Base_ptr)plVar7[1];
  *plVar7 = (long)p_Var16;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_150._M_left);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_380.field_2._M_allocated_capacity = *psVar9;
    local_380.field_2._8_8_ = plVar7[3];
  }
  else {
    local_380.field_2._M_allocated_capacity = *psVar9;
    local_380._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_380._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_300[0]);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_360.field_2._M_allocated_capacity = *psVar9;
    local_360.field_2._8_8_ = plVar7[3];
  }
  else {
    local_360.field_2._M_allocated_capacity = *psVar9;
    local_360._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_360._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_360);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_340.field_2._M_allocated_capacity = *psVar9;
    local_340.field_2._8_8_ = plVar7[3];
  }
  else {
    local_340.field_2._M_allocated_capacity = *psVar9;
    local_340._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_340._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_320[0]);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_438.field_2._M_allocated_capacity = *psVar9;
    local_438.field_2._8_8_ = plVar7[3];
  }
  else {
    local_438.field_2._M_allocated_capacity = *psVar9;
    local_438._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_438._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_438);
  pCVar12 = (Context *)(plVar7 + 2);
  if ((Context *)*plVar7 == pCVar12) {
    local_408.m_testCtx = pCVar12->m_testCtx;
    local_408.m_renderCtx = (RenderContext *)plVar7[3];
    local_418 = &local_408;
  }
  else {
    local_408.m_testCtx = pCVar12->m_testCtx;
    local_418 = (Context *)*plVar7;
  }
  local_410 = plVar7[1];
  *plVar7 = (long)pCVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_418,(ulong)local_2e0[0]);
  local_3d0 = &local_3c8._M_string_length;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_3c8._M_string_length = *psVar9;
    local_3c8.field_2._M_allocated_capacity = plVar7[3];
  }
  else {
    local_3c8._M_string_length = *psVar9;
    local_3d0 = (size_type *)*plVar7;
  }
  local_3c8._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  local_460 = &local_458._M_string_length;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_458._M_string_length = *psVar9;
    local_458.field_2._M_allocated_capacity = plVar7[3];
  }
  else {
    local_458._M_string_length = *psVar9;
    local_460 = (size_type *)*plVar7;
  }
  local_458._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_300[0]);
  local_488 = &local_480._M_string_length;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    local_480._M_string_length = *psVar9;
    local_480.field_2._M_allocated_capacity = plVar7[3];
  }
  else {
    local_480._M_string_length = *psVar9;
    local_488 = (size_type *)*plVar7;
  }
  local_480._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_488);
  pCVar10 = (ContextInfo *)(plVar7 + 2);
  if ((ContextInfo *)*plVar7 == pCVar10) {
    local_3f0._8_8_ = pCVar10->_vptr_ContextInfo;
    aStack_3e0._M_allocated_capacity = plVar7[3];
    local_408.m_contextInfo = pCVar3;
  }
  else {
    local_3f0._8_8_ = pCVar10->_vptr_ContextInfo;
    local_408.m_contextInfo = (ContextInfo *)*plVar7;
  }
  local_3f0._0_8_ = plVar7[1];
  *plVar7 = (long)pCVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_408.m_contextInfo,(ulong)local_320[0]);
  pbVar11 = (pointer)(plVar7 + 2);
  if ((pointer)*plVar7 == pbVar11) {
    local_100._16_8_ = (pbVar11->_M_dataplus)._M_p;
    pbStack_e8 = (pointer)plVar7[3];
    local_100._0_8_ = pbVar4;
  }
  else {
    local_100._16_8_ = (pbVar11->_M_dataplus)._M_p;
    local_100._0_8_ = (pointer)*plVar7;
  }
  local_100._8_8_ = plVar7[1];
  *plVar7 = (long)pbVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_100);
  local_3a8 = &local_398;
  pCVar12 = (Context *)(plVar7 + 2);
  if ((Context *)*plVar7 == pCVar12) {
    local_398.m_testCtx = pCVar12->m_testCtx;
    local_398.m_renderCtx = (RenderContext *)plVar7[3];
  }
  else {
    local_398.m_testCtx = pCVar12->m_testCtx;
    local_3a8 = (Context *)*plVar7;
  }
  local_3a0 = plVar7[1];
  *plVar7 = (long)pCVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((pointer)local_100._0_8_ != pbVar4) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if (local_408.m_contextInfo != pCVar3) {
    operator_delete(local_408.m_contextInfo,local_3f0._8_8_ + 1);
  }
  if (local_488 != &local_480._M_string_length) {
    operator_delete(local_488,local_480._M_string_length + 1);
  }
  if (local_460 != &local_458._M_string_length) {
    operator_delete(local_460,local_458._M_string_length + 1);
  }
  if (local_3d0 != &local_3c8._M_string_length) {
    operator_delete(local_3d0,local_3c8._M_string_length + 1);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,(ulong)((long)&(local_408.m_testCtx)->m_platform + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (local_150._M_left != (_Base_ptr)local_130) {
    operator_delete(local_150._M_left,local_130._0_8_ + 1);
  }
  if (local_170._M_left != &local_150) {
    operator_delete(local_170._M_left,local_150._0_8_ + 1);
  }
  if (local_190._M_left != &local_170) {
    operator_delete(local_190._M_left,local_170._0_8_ + 1);
  }
  if (local_1b0._M_left != &local_190) {
    operator_delete(local_1b0._M_left,local_190._0_8_ + 1);
  }
  if (local_1d0._M_left != &local_1b0) {
    operator_delete(local_1d0._M_left,local_1b0._0_8_ + 1);
  }
  if (local_1f0._M_left != &local_1d0) {
    operator_delete(local_1f0._M_left,local_1d0._0_8_ + 1);
  }
  if (local_210._M_left != &local_1f0) {
    operator_delete(local_210._M_left,local_1f0._0_8_ + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210._0_8_ + 1);
  }
  if ((_Base_ptr *)local_250.field_2._M_allocated_capacity != &local_230) {
    operator_delete((void *)local_250.field_2._M_allocated_capacity,
                    (ulong)((long)&local_230->_M_color + 1));
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,(ulong)(local_250._M_dataplus._M_p + 1));
  }
  if ((ContextInfo *)local_290._16_8_ != (ContextInfo *)(local_290 + 0x20)) {
    operator_delete((void *)local_290._16_8_,
                    (ulong)((long)&((_Alloc_hider *)local_290._32_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._16_8_ != &local_110) {
    operator_delete((void *)local_130._16_8_,local_110._M_allocated_capacity + 1);
  }
  local_418 = &local_408;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_418,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  local_398.m_contextInfo = (ContextInfo *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(local_100,0,0xac);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_438,(_anonymous_namespace_ *)this_00,(Context *)local_2b0.m_contextInfo,
             (char *)pCVar12);
  local_408.m_contextInfo = (ContextInfo *)((ulong)local_408.m_contextInfo & 0xffffffff00000000);
  local_3f0._0_8_ = &aStack_3e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3f0,local_438._M_dataplus._M_p,
             local_438._M_dataplus._M_p + local_438._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_408.m_contextInfo & 0xffffffff) * 0x18),
              (value_type *)local_3f0);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_340,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_2c0,
             (char *)pCVar12);
  local_488 = (size_type *)CONCAT44(local_488._4_4_,3);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,local_340._M_dataplus._M_p,
             local_340._M_dataplus._M_p + local_340._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_488 & 0xffffffff) * 0x18),&local_480);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_360,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_3a8,
             (char *)pCVar12);
  local_460 = (size_type *)CONCAT44(local_460._4_4_,4);
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_458,local_360._M_dataplus._M_p,
             local_360._M_dataplus._M_p + local_360._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_460 & 0xffffffff) * 0x18),&local_458);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_380,(_anonymous_namespace_ *)(this->super_TestCase).m_context,local_418,
             (char *)pCVar12);
  local_3d0 = (size_type *)CONCAT44(local_3d0._4_4_,1);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,local_380._M_dataplus._M_p,
             local_380._M_dataplus._M_p + local_380._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_3d0 & 0xffffffff) * 0x18),&local_3c8);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_398.m_contextInfo,renderCtx,(ProgramSources *)local_100);
  pSVar8 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar8->strongRefCount = 0;
  pSVar8->weakRefCount = 0;
  pSVar8->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b47b90;
  pSVar8[1]._vptr_SharedPtrStateBase = (_func_int **)local_398.m_contextInfo;
  pSVar8->strongRefCount = 1;
  pSVar8->weakRefCount = 1;
  pSVar6 = (this->m_program).m_state;
  if (pSVar6 != pSVar8) {
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar6->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_program).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar6 = (this->m_program).m_state;
        if (pSVar6 != (SharedPtrStateBase *)0x0) {
          (*pSVar6->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = (ShaderProgram *)local_398.m_contextInfo;
    (this->m_program).m_state = pSVar8;
    LOCK();
    pSVar8->strongRefCount = pSVar8->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_program).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  LOCK();
  pdVar1 = &pSVar8->strongRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar8->_vptr_SharedPtrStateBase[2])(pSVar8);
  }
  LOCK();
  pdVar1 = &pSVar8->weakRefCount;
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar8->_vptr_SharedPtrStateBase[1])(pSVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._0_8_ != &aStack_3e0) {
    operator_delete((void *)local_3f0._0_8_,aStack_3e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar18 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar18));
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_418 != &local_408) {
      operator_delete(local_418,(ulong)((long)&(local_408.m_testCtx)->m_platform + 1));
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8,(ulong)((long)&(local_398.m_testCtx)->m_platform + 1));
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,(ulong)((long)&(local_2b0.m_testCtx)->m_platform + 1));
    }
    if (local_2b0.m_contextInfo != (ContextInfo *)local_290) {
      operator_delete(local_2b0.m_contextInfo,(ulong)((long)(Platform **)local_290._0_8_ + 1));
    }
    if (local_320[0] != local_310) {
      operator_delete(local_320[0],local_310[0] + 1);
    }
    if (local_300[0] != local_2f0) {
      operator_delete(local_300[0],local_2f0[0] + 1);
    }
    plVar7 = local_2d0;
    if (local_2e0[0] != plVar7) {
      operator_delete(local_2e0[0],local_2d0[0] + 1);
      plVar7 = extraout_RAX;
    }
    return (int)plVar7;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x1914);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLPositionCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const bool		vsToTCS		= m_caseType == CASETYPE_VS_TO_TCS		|| m_caseType == CASETYPE_VS_TO_TCS_TO_TES;
	const bool		tcsToTES	= m_caseType == CASETYPE_TCS_TO_TES		|| m_caseType == CASETYPE_VS_TO_TCS_TO_TES;

	const string	tesIn0		= tcsToTES ? "gl_in[0].gl_Position" : "in_te_attr[0]";
	const string	tesIn1		= tcsToTES ? "gl_in[1].gl_Position" : "in_te_attr[1]";
	const string	tesIn2		= tcsToTES ? "gl_in[2].gl_Position" : "in_te_attr[2]";

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp vec4 in_v_attr;\n"
												 + string(!vsToTCS ? "out highp vec4 in_tc_attr;\n" : "") +
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	" + (vsToTCS ? "gl_Position" : "in_tc_attr") + " = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 3) out;\n"
												 "\n"
												 + string(!vsToTCS ? "in highp vec4 in_tc_attr[];\n" : "") +
												 "\n"
												 + (!tcsToTES ? "out highp vec4 in_te_attr[];\n" : "") +
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	" + (tcsToTES ? "gl_out[gl_InvocationID].gl_Position" : "in_te_attr[gl_InvocationID]") + " = "
													  + (vsToTCS ? "gl_in[gl_InvocationID].gl_Position" : "in_tc_attr[gl_InvocationID]") + ";\n"
												 "\n"
												 "	gl_TessLevelInner[0] = 2.0;\n"
												 "	gl_TessLevelInner[1] = 3.0;\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = 4.0;\n"
												 "	gl_TessLevelOuter[1] = 5.0;\n"
												 "	gl_TessLevelOuter[2] = 6.0;\n"
												 "	gl_TessLevelOuter[3] = 7.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_TRIANGLES) +
												 "\n"
												 + (!tcsToTES ? "in highp vec4 in_te_attr[];\n" : "") +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	highp vec2 xy = gl_TessCoord.x * " + tesIn0 + ".xy\n"
												 "	              + gl_TessCoord.y * " + tesIn1 + ".xy\n"
												 "	              + gl_TessCoord.z * " + tesIn2 + ".xy;\n"
												 "	gl_Position = vec4(xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(" + tesIn0 + ".z + " + tesIn1 + ".w,\n"
												 "	                  " + tesIn2 + ".z + " + tesIn0 + ".w,\n"
												 "	                  " + tesIn1 + ".z + " + tesIn2 + ".w,\n"
												 "	                  1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}